

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::GuessLibrarySOName(string *fullPath,string *soname)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *fname;
  ulong uVar5;
  ulong uVar6;
  string *psVar7;
  bool local_ad;
  undefined1 local_98 [8];
  string name;
  undefined1 local_48 [8];
  cmELF elf;
  string *soname_local;
  string *fullPath_local;
  
  elf.ErrorMessage.field_2._8_8_ = soname;
  fname = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_48,fname);
  bVar2 = cmELF::operator_cast_to_bool((cmELF *)local_48);
  if (bVar2) {
    fullPath_local._7_1_ =
         cmELF::GetSOName((cmELF *)local_48,(string *)elf.ErrorMessage.field_2._8_8_);
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsSymlink(fullPath);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::ReadSymlink(fullPath,(string *)elf.ErrorMessage.field_2._8_8_);
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath
                  ((string *)((long)&name.field_2 + 8),(string *)elf.ErrorMessage.field_2._8_8_);
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        if (((bVar3 ^ 0xff) & 1) == 0) {
          cmsys::SystemTools::GetFilenameName((string *)local_98,fullPath);
          uVar5 = std::__cxx11::string::length();
          uVar6 = std::__cxx11::string::length();
          uVar1 = elf.ErrorMessage.field_2._8_8_;
          local_ad = false;
          if (uVar6 < uVar5) {
            psVar7 = (string *)std::__cxx11::string::length();
            iVar4 = std::__cxx11::string::compare(uVar1,0,psVar7);
            local_ad = iVar4 == 0;
          }
          fullPath_local._7_1_ = local_ad;
          std::__cxx11::string::~string((string *)local_98);
        }
        else {
          fullPath_local._7_1_ = false;
        }
      }
      else {
        fullPath_local._7_1_ = false;
      }
    }
    else {
      fullPath_local._7_1_ = false;
    }
  }
  cmELF::~cmELF((cmELF *)local_48);
  return fullPath_local._7_1_;
}

Assistant:

bool cmSystemTools::GuessLibrarySOName(std::string const& fullPath,
                                       std::string& soname)
{
// For ELF shared libraries use a real parser to get the correct
// soname.
#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fullPath.c_str());
  if (elf) {
    return elf.GetSOName(soname);
  }
#endif

  // If the file is not a symlink we have no guess for its soname.
  if (!cmSystemTools::FileIsSymlink(fullPath)) {
    return false;
  }
  if (!cmSystemTools::ReadSymlink(fullPath, soname)) {
    return false;
  }

  // If the symlink has a path component we have no guess for the soname.
  if (!cmSystemTools::GetFilenamePath(soname).empty()) {
    return false;
  }

  // If the symlink points at an extended version of the same name
  // assume it is the soname.
  std::string name = cmSystemTools::GetFilenameName(fullPath);
  return soname.length() > name.length() &&
    soname.compare(0, name.length(), name) == 0;
}